

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void __thiscall FGUIDCVar::SetGenericRepDefault(FGUIDCVar *this,UCVarValue value,ECVarType type)

{
  uint32 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  UCVarValue UVar4;
  
  UVar4 = value;
  if (type != CVAR_GUID) {
    if (type == CVAR_String) {
      UVar4 = FBaseCVar::FromString(value.String,CVAR_GUID);
    }
    else {
      UVar4.String = (char *)0x0;
    }
  }
  if (UVar4.String != (char *)0x0) {
    uVar2 = *(undefined8 *)UVar4.String;
    uVar3 = *(undefined8 *)(UVar4.pGUID)->Data4;
    (this->Value).Data1 = (int)uVar2;
    (this->Value).Data2 = (short)((ulong)uVar2 >> 0x20);
    (this->Value).Data3 = (short)((ulong)uVar2 >> 0x30);
    *(undefined8 *)(this->Value).Data4 = uVar3;
    if (((this->super_FBaseCVar).Flags & 0x80) != 0) {
      FBaseCVar::SetGenericRep(&this->super_FBaseCVar,value,type);
      puVar1 = &(this->super_FBaseCVar).Flags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    }
  }
  return;
}

Assistant:

void FGUIDCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	const GUID *guid = ToGUID (value, type);
	if (guid != NULL)
	{
		Value = *guid;
		if (Flags & CVAR_ISDEFAULT)
		{
			SetGenericRep (value, type);
			Flags |= CVAR_ISDEFAULT;
		}
	}
}